

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jobs.c
# Opt level: O0

void sx__del_job(sx_job_context *ctx,sx__job *job)

{
  sx_lock_t sVar1;
  bool bVar2;
  sx_lock_t *psVar3;
  int _i_90;
  sx__job *job_local;
  sx_job_context *ctx_local;
  
  psVar3 = &ctx->job_lk;
  while( true ) {
    LOCK();
    sVar1 = *psVar3;
    *psVar3 = 1;
    UNLOCK();
    if (sVar1 == 0) break;
    do {
    } while (*psVar3 != 0);
  }
  bVar2 = false;
  while (!bVar2) {
    sx_pool_del(ctx->job_pool,job);
    ctx->job_lk = 0;
    bVar2 = true;
  }
  return;
}

Assistant:

static void sx__del_job(sx_job_context* ctx, sx__job* job)
{
    sx_lock(ctx->job_lk) {
        sx_pool_del(ctx->job_pool, job);
    }
}